

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O3

int lzham::lzham_lib_z_inflateReset(lzham_z_streamp pStream)

{
  lzham_z_internal_state *p;
  int iVar1;
  lzham_decompress_state_ptr pvVar2;
  lzham_decompress_params params;
  lzham_decompress_params local_28;
  
  iVar1 = -2;
  if ((pStream != (lzham_z_streamp)0x0) && (p = pStream->state, p != (lzham_z_internal_state *)0x0))
  {
    local_28._32_8_ = *(undefined8 *)(p + 0x158);
    local_28._0_8_ = *(undefined8 *)(p + 0x138);
    local_28._8_8_ = *(undefined8 *)(p + 0x140);
    local_28._16_8_ = *(undefined8 *)(p + 0x148);
    local_28.m_pSeed_bytes = *(void **)(p + 0x150);
    pvVar2 = lzham_lib_decompress_reinit(p,&local_28);
    iVar1 = (uint)(pvVar2 != (lzham_decompress_state_ptr)0x0) * 2 + -2;
  }
  return iVar1;
}

Assistant:

int LZHAM_CDECL lzham_lib_z_inflateReset(lzham_z_streamp pStream)
   {
      if ((!pStream) || (!pStream->state)) 
         return LZHAM_Z_STREAM_ERROR;

      lzham_decompress_state_ptr pState = static_cast<lzham_decompress_state_ptr>(pStream->state);
      lzham_decompressor *pDecomp = static_cast<lzham_decompressor *>(pState);
      
      lzham_decompress_params params(pDecomp->m_params);

      if (!lzham_lib_decompress_reinit(pState, &params))
         return LZHAM_Z_STREAM_ERROR;

      return LZHAM_Z_OK;
   }